

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

int __thiscall GF2::BFunc<9UL>::Deg(BFunc<9UL> *this)

{
  int iVar1;
  MP<9UL,_GF2::MOLex<9UL>_> poly;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  BFunc<9UL> *in_stack_ffffffffffffffd0;
  
  MP<9UL,_GF2::MOLex<9UL>_>::MP
            ((MP<9UL,_GF2::MOLex<9UL>_> *)in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf)
  ;
  BFunc<9ul>::To<GF2::MOLex<9ul>>
            (in_stack_ffffffffffffffd0,
             (MP<9UL,_GF2::MOLex<9UL>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  iVar1 = MP<9UL,_GF2::MOLex<9UL>_>::Deg
                    ((MP<9UL,_GF2::MOLex<9UL>_> *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  MP<9UL,_GF2::MOLex<9UL>_>::~MP((MP<9UL,_GF2::MOLex<9UL>_> *)0x1c908f);
  return iVar1;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}